

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintCallGraph.cpp
# Opt level: O0

void __thiscall
wasm::PrintCallGraph::run(wasm::Module*)::CallPrinter::CallPrinter(wasm::Module__
          (void *this,Module *module)

{
  Module *module_local;
  CallPrinter *this_local;
  
  PostWalker<CallPrinter,_wasm::Visitor<CallPrinter,_void>_>::PostWalker
            ((PostWalker<CallPrinter,_wasm::Visitor<CallPrinter,_void>_> *)this);
  *(Module **)((long)this + 0xd8) = module;
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::set
            ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
             ((long)this + 0xe8));
  std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
            ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)((long)this + 0x118));
  wasm::ModuleUtils::
  iterDefinedFunctions<wasm::PrintCallGraph::run(wasm::Module*)::CallPrinter::CallPrinter(wasm::Module*)::_lambda(wasm::Function*)_1_>
            (module,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

CallPrinter(Module* module) : module(module) {
        // Walk function bodies.
        ModuleUtils::iterDefinedFunctions(*module, [&](Function* curr) {
          currFunction = curr;
          visitedTargets.clear();
          walk(curr->body);
        });
      }